

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::anon_unknown_0::EvolutionTestMain::run
          (Validity *__return_storage_ptr__,EvolutionTestMain *this)

{
  char (*in_R8) [2];
  ArrayPtr<unsigned_char> AVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  undefined1 local_c8 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:899:5)>
  _kjContext899;
  anon_class_8_1_8991fb9c _kjContextFunc899;
  FdOutputStream local_40;
  undefined1 local_30 [8];
  String text;
  EvolutionTestMain *this_local;
  
  text.content.disposer = (ArrayDisposer *)this;
  setenv("CAPNP_IGNORE_ISSUE_344","1",1);
  srand(this->seed);
  kj::str<char_const(&)[63],unsigned_int&,char_const(&)[2]>
            ((String *)local_30,
             (kj *)"Randomly testing backwards-compatibility scenarios with seed: ",
             (char (*) [63])&this->seed,(uint *)0x2f1047,in_R8);
  kj::FdOutputStream::FdOutputStream(&local_40,1);
  AVar1 = kj::String::asBytes((String *)local_30);
  _kjContextFunc899.this = (EvolutionTestMain *)AVar1.ptr;
  AVar2 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&_kjContextFunc899);
  kj::FdOutputStream::write(&local_40,(int)AVar2.ptr,(void *)AVar2.size_,(size_t)AVar2.ptr);
  kj::FdOutputStream::~FdOutputStream(&local_40);
  kj::String::~String((String *)local_30);
  _kjContext899.func = (anon_class_8_1_8991fb9c *)this;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:899:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:899:5)>
                 *)local_c8,(anon_class_8_1_8991fb9c *)&_kjContext899.func);
  doTest();
  kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:899:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:899:5)>
                  *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity run() {
    // https://github.com/capnproto/capnproto/issues/344 describes an obscure bug in the layout
    // algorithm, the fix for which breaks backwards-compatibility for any schema triggering the
    // bug. In order to avoid silently breaking protocols, we are temporarily throwing an exception
    // in cases where this bug would have occurred, so that people can decide what to do.
    // However, the evolution test can occasionally trigger the bug (depending on the random path
    // it takes). Rather than try to avoid it, we disable the exception-throwing, because the bug
    // is actually fixed, and the exception is only there to raise awareness of the compatibility
    // concerns.
    //
    // On Linux, seed 1467142714 (for example) will trigger the exception (without this env var).
#if defined(__MINGW32__) || defined(_MSC_VER)
    putenv("CAPNP_IGNORE_ISSUE_344=1");
#else
    setenv("CAPNP_IGNORE_ISSUE_344", "1", true);
#endif

    srand(seed);

    {
      kj::String text = kj::str(
          "Randomly testing backwards-compatibility scenarios with seed: ", seed, "\n");
      kj::FdOutputStream(STDOUT_FILENO).write(text.asBytes());
    }

    KJ_CONTEXT(seed, "PLEASE REPORT THIS FAILURE AND INCLUDE THE SEED");

    doTest();

    return true;
  }